

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  __sighandler_t p_Var1;
  __sighandler_t previousSignalHandler;
  thread local_1e8;
  __sighandler_t local_1e0;
  Autotune *local_1d8;
  long lStack_1d0;
  Args local_1c8;
  
  lStack_1d0 = std::chrono::_V2::steady_clock::now();
  local_1d8 = this;
  Args::Args(&local_1c8,args);
  local_1e8._M_id._M_thread = (id)0;
  p_Var1 = (__sighandler_t)operator_new(0x1b8);
  *(undefined ***)p_Var1 = &PTR___State_impl_00146658;
  *(Autotune **)(p_Var1 + 8) = local_1d8;
  *(long *)(p_Var1 + 0x10) = lStack_1d0;
  Args::Args((Args *)(p_Var1 + 0x18),&local_1c8);
  local_1e0 = p_Var1;
  std::thread::_M_start_thread(&local_1e8,&local_1e0,0);
  if (local_1e0 != (__sighandler_t)0x0) {
    (**(code **)(*(long *)local_1e0 + 8))();
  }
  if ((this->timer_)._M_id._M_thread == 0) {
    (this->timer_)._M_id._M_thread = (native_handle_type)local_1e8._M_id._M_thread;
    local_1e8._M_id._M_thread = (id)0;
    Args::~Args(&local_1c8);
    this->bestScore_ = -1.0;
    this->trials_ = 0;
    LOCK();
    (this->continueTraining_)._M_base._M_i = true;
    UNLOCK();
    local_1e0 = signal(2,anon_unknown.dwarf_3e3a5::signalHandler);
    local_1c8.manualArgs_._M_h._M_buckets =
         (__buckets_ptr)(anonymous_namespace)::interruptSignalHandler._16_8_;
    local_1d8 = (Autotune *)(anonymous_namespace)::interruptSignalHandler._0_8_;
    lStack_1d0 = (anonymous_namespace)::interruptSignalHandler._8_8_;
    (anonymous_namespace)::interruptSignalHandler._16_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/autotune.cc:270:28)>
         ::_M_manager;
    local_1c8.manualArgs_._M_h._M_bucket_count =
         (anonymous_namespace)::interruptSignalHandler._24_8_;
    (anonymous_namespace)::interruptSignalHandler._24_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/autotune.cc:270:28)>
         ::_M_invoke;
    (anonymous_namespace)::interruptSignalHandler._0_8_ = &local_1e0;
    (anonymous_namespace)::interruptSignalHandler._8_8_ = this;
    if (local_1c8.manualArgs_._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)local_1c8.manualArgs_._M_h._M_buckets)(&local_1d8,&local_1d8,3);
    }
    return;
  }
  std::terminate();
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}